

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOBoard.cpp
# Opt level: O0

bool __thiscall
IOBoard::validate(IOBoard *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *values)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  const_reference pvVar4;
  iterator __first;
  iterator __last;
  reference puVar5;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a8;
  unsigned_long *local_a0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_98;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_90;
  uint local_84;
  iterator iStack_80;
  uint test;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  allocator<unsigned_int> local_45;
  value_type_conflict local_44;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> testValues;
  uint boardSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *values_local;
  IOBoard *this_local;
  
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(values);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](values,sVar3 - 1);
  testValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)*pvVar4;
  if ((testValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ < 4) ||
     (7 < testValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_)) {
    Message::putMessage(FILE_ERROR_SIZE_IMPROPER);
    this_local._7_1_ = false;
  }
  else {
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(values);
    if (sVar3 == testValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ *
                 testValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      uVar2 = testValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ *
              testValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_;
      local_44 = 0;
      std::allocator<unsigned_int>::allocator(&local_45);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,(ulong)uVar2,
                 &local_44,&local_45);
      std::allocator<unsigned_int>::~allocator(&local_45);
      __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
      __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
      std::
      iota<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )__first._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )__last._M_current,0);
      __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
      iStack_80 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          (&__end1,&stack0xffffffffffffff80);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        puVar5 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end1);
        local_84 = *puVar5;
        local_98._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(values);
        local_a0 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cend(values);
        local_90 = std::
                   find<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_int>
                             (local_98,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                        )local_a0,&local_84);
        local_a8._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cend(values);
        bVar1 = __gnu_cxx::
                operator==<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          (&local_90,&local_a8);
        if (bVar1) {
          Message::putMessage(FILE_ERROR_VALUE_IMPROPER);
          this_local._7_1_ = false;
          goto LAB_00139252;
        }
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end1);
      }
      this_local._7_1_ = true;
LAB_00139252:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
    }
    else {
      Message::putMessage(FILE_ERROR_SIZE_NOT_FIT_VALUES);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool IOBoard::validate( const std::vector<size_t>& values ) const
{
    uint boardSize = values[values.size() -1];
    if (( boardSize < 4 ) || ( boardSize > 7 ))
    {
        Message::putMessage( Result::FILE_ERROR_SIZE_IMPROPER );
        return false;
    }

    if ( values.size() != boardSize * boardSize + 1 )
    {
        Message::putMessage( Result::FILE_ERROR_SIZE_NOT_FIT_VALUES );
        return false;
    }

    std::vector<uint> testValues( boardSize * boardSize, 0 );
    std::iota( testValues.begin(), testValues.end(), 0 );

    for ( uint test : testValues )
    {
        if ( std::find( values.cbegin(), values.cend(), test ) == values.cend() )
        {
            Message::putMessage( Result::FILE_ERROR_VALUE_IMPROPER );
            return false;
        }
    }
    return true;
}